

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall QByteArray::prepend(QByteArray *this,QByteArray *ba)

{
  Data *pDVar1;
  QByteArray *pQVar2;
  long lVar3;
  QByteArrayView data;
  
  if ((this->d).size == 0) {
    pDVar1 = (this->d).d;
    if (pDVar1 == (Data *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (pDVar1->super_QArrayData).alloc;
    }
    if ((lVar3 < (ba->d).size) && ((ba->d).d != (Data *)0x0)) {
      QArrayDataPointer<char>::operator=(&this->d,&ba->d);
      return this;
    }
  }
  data.m_data = (ba->d).ptr;
  data.m_size = (ba->d).size;
  pQVar2 = insert(this,0,data);
  return pQVar2;
}

Assistant:

QByteArray &QByteArray::prepend(const QByteArray &ba)
{
    if (size() == 0 && ba.size() > d.constAllocatedCapacity() && ba.d.isMutable())
        return (*this = ba);
    return prepend(QByteArrayView(ba));
}